

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ecf33::SwiftGetVersionCommand::getShortDescription
          (SwiftGetVersionCommand *this,SmallVectorImpl<char> *result)

{
  raw_svector_ostream local_48;
  SmallVectorImpl<char> *local_18;
  SmallVectorImpl<char> *result_local;
  SwiftGetVersionCommand *this_local;
  
  local_18 = result;
  result_local = (SmallVectorImpl<char> *)this;
  llvm::raw_svector_ostream::raw_svector_ostream(&local_48,result);
  llvm::raw_ostream::operator<<((raw_ostream *)&local_48,"Checking Swift Compiler Version");
  llvm::raw_svector_ostream::~raw_svector_ostream(&local_48);
  return;
}

Assistant:

virtual void getShortDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << "Checking Swift Compiler Version";
  }